

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExtract.c
# Opt level: O0

Vec_Wrd_t * Abc_NtkShareSuperXor(Abc_Obj_t *pObj,int *pfCompl,int *pCounter)

{
  Abc_Obj_t *pAVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  Vec_Wrd_t *p;
  word wVar5;
  Abc_Obj_t *pAVar6;
  word wVar7;
  uint local_6c;
  int local_68;
  int fCompl;
  int k;
  int i;
  word NumNext;
  word Num;
  Vec_Wrd_t *vSuper;
  Abc_Obj_t *pRoot;
  Abc_Obj_t *pObj1;
  Abc_Obj_t *pObj0;
  Abc_Obj_t *pObjC;
  Abc_Ntk_t *pNtk;
  int *pCounter_local;
  int *pfCompl_local;
  Abc_Obj_t *pObj_local;
  
  pNtk = (Abc_Ntk_t *)pCounter;
  pCounter_local = pfCompl;
  pfCompl_local = (int *)pObj;
  pObjC = (Abc_Obj_t *)Abc_ObjNtk(pObj);
  vSuper = (Vec_Wrd_t *)0x0;
  local_6c = 0;
  iVar2 = Abc_ObjIsComplement((Abc_Obj_t *)pfCompl_local);
  if (iVar2 != 0) {
    __assert_fail("!Abc_ObjIsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcExtract.c"
                  ,0x66,"Vec_Wrd_t *Abc_NtkShareSuperXor(Abc_Obj_t *, int *, int *)");
  }
  iVar2 = Abc_NodeIsExorType((Abc_Obj_t *)pfCompl_local);
  if (iVar2 == 0) {
    __assert_fail("Abc_NodeIsExorType(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcExtract.c"
                  ,0x67,"Vec_Wrd_t *Abc_NtkShareSuperXor(Abc_Obj_t *, int *, int *)");
  }
  p = Vec_WrdAlloc(10);
  iVar2 = Abc_ObjLevel((Abc_Obj_t *)pfCompl_local);
  uVar3 = Abc_ObjId((Abc_Obj_t *)pfCompl_local);
  wVar5 = Abc_NtkSharePack(iVar2,uVar3);
  Vec_WrdPush(p,wVar5);
  while (iVar2 = Vec_WrdSize(p), 0 < iVar2) {
    NumNext = Vec_WrdEntry(p,0);
    for (fCompl = 1; iVar2 = Vec_WrdSize(p), fCompl < iVar2; fCompl = fCompl + 1) {
      wVar5 = Vec_WrdEntry(p,fCompl);
      if (wVar5 <= NumNext) {
        __assert_fail("Num < NumNext",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcExtract.c"
                      ,0x71,"Vec_Wrd_t *Abc_NtkShareSuperXor(Abc_Obj_t *, int *, int *)");
      }
      NumNext = wVar5;
    }
    fCompl = Vec_WrdSize(p);
    do {
      fCompl = fCompl + -1;
      if (fCompl < 0) goto LAB_0029810b;
      wVar5 = Vec_WrdEntry(p,fCompl);
      pAVar1 = pObjC;
      iVar2 = Abc_NtkShareUnpackId(wVar5);
      vSuper = (Vec_Wrd_t *)Abc_NtkObj((Abc_Ntk_t *)pAVar1,iVar2);
      iVar2 = Abc_NodeIsExorType((Abc_Obj_t *)vSuper);
    } while (iVar2 == 0);
    Vec_WrdRemove(p,wVar5);
LAB_0029810b:
    if (fCompl == -1) break;
    pObj0 = Abc_NodeRecognizeMux((Abc_Obj_t *)vSuper,&pRoot,&pObj1);
    pAVar1 = pRoot;
    pAVar6 = Abc_ObjNot(pObj1);
    if (pAVar1 != pAVar6) {
      __assert_fail("pObj1 == Abc_ObjNot(pObj0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcExtract.c"
                    ,0x82,"Vec_Wrd_t *Abc_NtkShareSuperXor(Abc_Obj_t *, int *, int *)");
    }
    uVar3 = Abc_ObjIsComplement(pObj0);
    pObj0 = Abc_ObjRegular(pObj0);
    uVar4 = Abc_ObjIsComplement(pObj1);
    local_6c = uVar4 ^ uVar3 ^ local_6c;
    pObj1 = Abc_ObjRegular(pObj1);
    iVar2 = Abc_ObjLevel(pObj0);
    uVar3 = Abc_ObjId(pObj0);
    wVar5 = Abc_NtkSharePack(iVar2,uVar3);
    Vec_WrdPushOrder(p,wVar5);
    iVar2 = Abc_ObjLevel(pObj1);
    uVar3 = Abc_ObjId(pObj1);
    wVar5 = Abc_NtkSharePack(iVar2,uVar3);
    Vec_WrdPushOrder(p,wVar5);
    pNtk->ntkType = pNtk->ntkType + ABC_NTK_NETLIST;
    local_68 = 0;
    for (fCompl = 0; iVar2 = Vec_WrdSize(p), fCompl < iVar2; fCompl = fCompl + 1) {
      wVar5 = Vec_WrdEntry(p,fCompl);
      iVar2 = Vec_WrdSize(p);
      if (fCompl + 1 == iVar2) {
        Vec_WrdWriteEntry(p,local_68,wVar5);
        local_68 = local_68 + 1;
        break;
      }
      wVar7 = Vec_WrdEntry(p,fCompl + 1);
      if (wVar7 < wVar5) {
        __assert_fail("Num <= NumNext",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcExtract.c"
                      ,0x92,"Vec_Wrd_t *Abc_NtkShareSuperXor(Abc_Obj_t *, int *, int *)");
      }
      if (wVar5 == wVar7) {
        fCompl = fCompl + 1;
      }
      else {
        Vec_WrdWriteEntry(p,local_68,wVar5);
        local_68 = local_68 + 1;
      }
    }
    Vec_WrdShrink(p,local_68);
  }
  *pCounter_local = local_6c;
  for (fCompl = 0; iVar2 = Vec_WrdSize(p), fCompl < iVar2; fCompl = fCompl + 1) {
    wVar5 = Vec_WrdEntry(p,fCompl);
    iVar2 = Abc_NtkShareUnpackId(wVar5);
    Vec_WrdWriteEntry(p,fCompl,(long)iVar2);
  }
  return p;
}

Assistant:

Vec_Wrd_t * Abc_NtkShareSuperXor( Abc_Obj_t * pObj, int * pfCompl, int * pCounter )
{
    Abc_Ntk_t * pNtk = Abc_ObjNtk(pObj);
    Abc_Obj_t * pObjC, * pObj0, * pObj1, * pRoot = NULL;
    Vec_Wrd_t * vSuper;
    word Num, NumNext;
    int i, k, fCompl = 0;
    assert( !Abc_ObjIsComplement(pObj) );
    assert( Abc_NodeIsExorType(pObj) );
    // start iteration
    vSuper = Vec_WrdAlloc( 10 );
    Vec_WrdPush( vSuper, Abc_NtkSharePack(Abc_ObjLevel(pObj), Abc_ObjId(pObj)) );
    while ( Vec_WrdSize(vSuper) > 0 )
    {
        // make sure there are no duplicates
        Num = Vec_WrdEntry( vSuper, 0 );
        Vec_WrdForEachEntryStart( vSuper, NumNext, i, 1 )
        {
            assert( Num < NumNext );
            Num = NumNext;
        }
        // extract XOR gate decomposable on the topmost level
        Vec_WrdForEachEntryReverse( vSuper, Num, i )
        {
            pRoot = Abc_NtkObj( pNtk, Abc_NtkShareUnpackId(Num) );
            if ( Abc_NodeIsExorType(pRoot) )
            {
                Vec_WrdRemove( vSuper, Num );
                break;
            }
        }
        if ( i == -1 )
            break;
        // extract
        pObjC = Abc_NodeRecognizeMux( pRoot, &pObj1, &pObj0 );
        assert( pObj1 == Abc_ObjNot(pObj0) );
        fCompl ^= Abc_ObjIsComplement(pObjC);  pObjC = Abc_ObjRegular(pObjC);
        fCompl ^= Abc_ObjIsComplement(pObj0);  pObj0 = Abc_ObjRegular(pObj0);
        Vec_WrdPushOrder( vSuper, Abc_NtkSharePack(Abc_ObjLevel(pObjC), Abc_ObjId(pObjC)) );
        Vec_WrdPushOrder( vSuper, Abc_NtkSharePack(Abc_ObjLevel(pObj0), Abc_ObjId(pObj0)) );
        (*pCounter)++;
        // remove duplicates
        k = 0;
        Vec_WrdForEachEntry( vSuper, Num, i )
        {
            if ( i + 1 == Vec_WrdSize(vSuper) )
            {
                Vec_WrdWriteEntry( vSuper, k++, Num );
                break;
            }
            NumNext = Vec_WrdEntry( vSuper, i+1 );
            assert( Num <= NumNext );
            if ( Num == NumNext )
                i++;
            else
                Vec_WrdWriteEntry( vSuper, k++, Num );
        }
        Vec_WrdShrink( vSuper, k );
    }
    *pfCompl = fCompl;
    Vec_WrdForEachEntry( vSuper, Num, i )
        Vec_WrdWriteEntry( vSuper, i, Abc_NtkShareUnpackId(Num) );
    return vSuper;
}